

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int ly_set_rm_index(ly_set *set,uint index)

{
  uint uVar1;
  lys_node **pplVar2;
  
  if ((set != (ly_set *)0x0) && (index + 1 <= set->number)) {
    uVar1 = set->number - 1;
    pplVar2 = (set->set).s;
    if (uVar1 == index) {
      pplVar2 = pplVar2 + index;
    }
    else {
      pplVar2[index] = pplVar2[uVar1];
      pplVar2 = (set->set).s + uVar1;
    }
    *pplVar2 = (lys_node *)0x0;
    set->number = uVar1;
    return 0;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_rm_index");
  return 1;
}

Assistant:

API int
ly_set_rm_index(struct ly_set *set, unsigned int index)
{
    if (!set || (index + 1) > set->number) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (index == set->number - 1) {
        /* removing last item in set */
        set->set.g[index] = NULL;
    } else {
        /* removing item somewhere in a middle, so put there the last item */
        set->set.g[index] = set->set.g[set->number - 1];
        set->set.g[set->number - 1] = NULL;
    }
    set->number--;

    return EXIT_SUCCESS;
}